

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_MfsWinSweepLeafTfo_rec(Abc_Obj_t *pObj,int nLevelLimit)

{
  int iVar1;
  long lVar2;
  
  if ((((int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelLimit) &&
      (1 < (*(uint *)&pObj->field_0x14 & 0xf) - 3)) &&
     (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pObj);
    for (lVar2 = 0; lVar2 < (pObj->vFanouts).nSize; lVar2 = lVar2 + 1) {
      Abc_MfsWinSweepLeafTfo_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]],nLevelLimit)
      ;
    }
  }
  return;
}

Assistant:

static inline int         Abc_ObjIsCo( Abc_Obj_t * pObj )            { return pObj->Type == ABC_OBJ_PO || pObj->Type == ABC_OBJ_BI; }